

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O1

value method_metadata(method_conflict m)

{
  char *__s;
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  size_t length;
  value pvVar4;
  value pvVar5;
  value pvVar6;
  
  pvVar1 = value_create_array((value *)0x0,2);
  pvVar3 = (value)0x0;
  if (pvVar1 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar1);
    pvVar3 = value_create_string("name",4);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      __s = m->name;
      length = strlen(__s);
      pvVar4 = value_create_string(__s,length);
      ppvVar2[1] = pvVar4;
      pvVar3 = pvVar1;
      if (pvVar4 != (value)0x0) goto LAB_0011c72c;
    }
    value_type_destroy(pvVar1);
    pvVar3 = (value)0x0;
  }
LAB_0011c72c:
  if (pvVar3 == (value)0x0) {
    return (value)0x0;
  }
  pvVar4 = value_create_array((value *)0x0,2);
  pvVar1 = (value)0x0;
  if (pvVar4 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar4);
    pvVar1 = value_create_string("signature",9);
    *ppvVar2 = pvVar1;
    if (pvVar1 != (value)0x0) {
      pvVar5 = signature_metadata(m->s);
      ppvVar2[1] = pvVar5;
      pvVar1 = pvVar4;
      if (pvVar5 != (value)0x0) goto LAB_0011c792;
    }
    value_type_destroy(pvVar4);
    pvVar1 = (value)0x0;
  }
LAB_0011c792:
  if (pvVar1 == (value)0x0) goto LAB_0011c85c;
  pvVar5 = value_create_array((value *)0x0,2);
  pvVar4 = (value)0x0;
  if (pvVar5 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar5);
    pvVar4 = value_create_string("async",5);
    *ppvVar2 = pvVar4;
    if (pvVar4 != (value)0x0) {
      pvVar6 = value_create_bool('\0');
      ppvVar2[1] = pvVar6;
      pvVar4 = pvVar5;
      if (pvVar6 != (value)0x0) goto LAB_0011c801;
    }
    value_type_destroy(pvVar5);
    pvVar4 = (value)0x0;
  }
LAB_0011c801:
  if (pvVar4 != (value)0x0) {
    pvVar5 = class_visibility_value_pair(m->visibility);
    if (pvVar5 != (value)0x0) {
      pvVar6 = value_create_map((value *)0x0,4);
      if (pvVar6 != (value)0x0) {
        ppvVar2 = value_to_map(pvVar6);
        *ppvVar2 = pvVar3;
        ppvVar2[1] = pvVar1;
        ppvVar2[2] = pvVar4;
        ppvVar2[3] = pvVar5;
        return pvVar6;
      }
      value_type_destroy(pvVar5);
    }
    value_type_destroy(pvVar4);
  }
  value_type_destroy(pvVar1);
LAB_0011c85c:
  value_type_destroy(pvVar3);
  return (value)0x0;
}

Assistant:

value method_metadata(method m)
{
	value name, sig, async, visibility, metatada;
	value *m_map;

	/* Create method name array */
	name = method_metadata_name(m);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = method_metadata_signature(m);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create method async array */
	async = method_metadata_async(m);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create method visibility array */
	visibility = method_metadata_visibility(m);

	if (visibility == NULL)
	{
		goto error_visibility;
	}

	/* Create method map (name + signature + async + visibility) */
	metatada = value_create_map(NULL, 4);

	if (metatada == NULL)
	{
		goto error_method;
	}

	m_map = value_to_map(metatada);

	m_map[0] = name;
	m_map[1] = sig;
	m_map[2] = async;
	m_map[3] = visibility;

	return metatada;

error_method:
	value_type_destroy(visibility);
error_visibility:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}